

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NonLocalBCImpl.H
# Opt level: O0

Box * __thiscall
amrex::NonLocalBC::Rotate90CounterClockWise::operator()(Rotate90CounterClockWise *this,Box *box)

{
  int i;
  int j;
  int iVar1;
  int j_00;
  int k;
  Box *in_RDX;
  Box *in_RDI;
  IntVect IVar2;
  IntVect *in_stack_ffffffffffffff48;
  Rotate90CounterClockWise *this_00;
  undefined8 local_68;
  int local_60;
  IntVect local_58;
  undefined8 local_4c;
  int local_44;
  int local_40 [3];
  Rotate90CounterClockWise local_2c [12];
  undefined8 local_20;
  int local_18;
  Box *local_10;
  
  local_10 = in_RDX;
  i = Box::smallEnd(in_RDX,0);
  j = Box::bigEnd(local_10,1);
  iVar1 = Box::smallEnd(local_10,2);
  this_00 = local_2c;
  IntVect::IntVect((IntVect *)this_00,i,j,iVar1);
  IVar2 = operator()(this_00,(IntVect *)CONCAT44(j,i));
  local_40[2] = IVar2.vect[2];
  local_18 = local_40[2];
  local_40._0_8_ = IVar2.vect._0_8_;
  local_20._0_4_ = local_40[0];
  local_20._4_4_ = local_40[1];
  local_40 = IVar2.vect;
  iVar1 = Box::bigEnd(local_10,0);
  j_00 = Box::smallEnd(local_10,1);
  k = Box::bigEnd(local_10,2);
  IntVect::IntVect(&local_58,iVar1,j_00,k);
  IVar2 = operator()(this_00,(IntVect *)CONCAT44(j,i));
  local_68 = IVar2.vect._0_8_;
  local_4c = local_68;
  local_60 = IVar2.vect[2];
  local_44 = local_60;
  Box::Box((Box *)CONCAT44(j,i),in_stack_ffffffffffffff48,(IntVect *)0x12b1acc);
  return in_RDI;
}

Assistant:

Box operator() (Box const& box) const noexcept {
        return Box(operator()(IntVect{AMREX_D_DECL(box.smallEnd(0),
                                                   box.bigEnd  (1),
                                                   box.smallEnd(2))}),
                   operator()(IntVect{AMREX_D_DECL(box.bigEnd  (0),
                                                   box.smallEnd(1),
                                                   box.bigEnd  (2))}));
    }